

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O3

EncodeNumberStatus
spvtools::utils::ParseAndEncodeIntegerNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  uint *puVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  unsigned_long uVar7;
  bool bVar8;
  code *pcVar9;
  char *pcVar10;
  bool bVar11;
  uint64_t decoded_bits;
  int64_t decoded_signed;
  ErrorMsgStream local_50;
  unsigned_long local_40;
  unsigned_long local_38;
  
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
    text = "The given text is a nullptr";
LAB_005d7905:
    (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,text);
  }
  else {
    if (1 < type->kind - SPV_NUMBER_UNSIGNED_INT) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
      pcVar10 = "The expected type is not a integer type";
LAB_005d7930:
      (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,pcVar10);
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_50);
      return kInvalidUsage;
    }
    uVar3 = type->bitwidth;
    if (0x40 < uVar3) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,"Unsupported ");
      if (CONCAT44(local_50.stream_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   local_50.stream_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_4_) != 0) {
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(local_50.stream_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            local_50.stream_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._0_4_));
      }
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_50,"-bit integer literals");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_50);
      return kUnsupported;
    }
    cVar2 = *text;
    if (type->kind < SPV_NUMBER_SIGNED_INT && cVar2 == '-') {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
      pcVar10 = "Cannot put a negative number in an unsigned literal";
      goto LAB_005d7930;
    }
    if (cVar2 == '0') {
      bVar11 = (text[1] & 0xdfU) == 0x58;
LAB_005d799f:
      bVar8 = ParseNumber<unsigned_long>(text,&local_40);
      if (!bVar8) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
        pcVar10 = "Invalid unsigned integer literal: ";
LAB_005d7ab8:
        (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,pcVar10);
        goto LAB_005d7905;
      }
      bVar8 = CheckRangeAndIfHexThenSignExtend<unsigned_long>(local_40,type,bVar11,&local_40);
      if (bVar8) {
LAB_005d7a2f:
        uVar7 = local_40;
        local_50.stream_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = (undefined4)local_40;
        if (0x20 < uVar3) {
          if ((emit->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005d7bfc;
          (*emit->_M_invoker)((_Any_data *)emit,(uint *)&local_50);
          local_50.stream_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = (undefined4)(uVar7 >> 0x20);
        }
        if ((emit->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*emit->_M_invoker)((_Any_data *)emit,(uint *)&local_50);
          return kSuccess;
        }
LAB_005d7bfc:
        std::__throw_bad_function_call();
      }
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,"Integer ");
      plVar6 = (long *)CONCAT44(local_50.stream_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_50.stream_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_);
      if (plVar6 != (long *)0x0) {
        if (bVar11 == false) {
          pcVar9 = std::dec;
        }
        else {
          pcVar9 = std::hex;
        }
        (*pcVar9)((long)plVar6 + *(long *)(*plVar6 + -0x18));
        plVar6 = (long *)CONCAT44(local_50.stream_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  local_50.stream_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_4_);
        if (plVar6 != (long *)0x0) {
          puVar1 = (uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x18);
          *puVar1 = *puVar1 | 0x200;
          std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
        }
      }
    }
    else {
      if (cVar2 != '-') {
        bVar11 = false;
        goto LAB_005d799f;
      }
      local_38 = 0;
      bVar11 = ParseNumber<long>(text,(long *)&local_38);
      if (!bVar11) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
        pcVar10 = "Invalid signed integer literal: ";
        goto LAB_005d7ab8;
      }
      bVar11 = CheckRangeAndIfHexThenSignExtend<long>(local_38,type,false,(long *)&local_38);
      if (bVar11) {
        local_40 = local_38;
        goto LAB_005d7a2f;
      }
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_50,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,"Integer ");
      plVar6 = (long *)CONCAT44(local_50.stream_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_50.stream_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_);
      if (plVar6 != (long *)0x0) {
        lVar4 = *plVar6;
        lVar5 = *(long *)(lVar4 + -0x18);
        *(uint *)((long)plVar6 + lVar5 + 0x18) =
             *(uint *)((long)plVar6 + lVar5 + 0x18) & 0xffffffb5 | 2;
        puVar1 = (uint *)((long)plVar6 + *(long *)(lVar4 + -0x18) + 0x18);
        *puVar1 = *puVar1 | 0x200;
        std::ostream::_M_insert<long>((long)plVar6);
      }
    }
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_50," does not fit in a ");
    plVar6 = (long *)CONCAT44(local_50.stream_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_,
                              local_50.stream_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._0_4_);
    if (plVar6 != (long *)0x0) {
      *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x18) =
           *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
    }
    (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,"-bit ");
    pcVar10 = "unsigned";
    if ((type->kind & ~SPV_NUMBER_UNSIGNED_INT) == SPV_NUMBER_SIGNED_INT) {
      pcVar10 = "signed";
    }
    (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50,pcVar10);
    (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_50," integer");
  }
  anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_50);
  return kInvalidText;
}

Assistant:

EncodeNumberStatus ParseAndEncodeIntegerNumber(
    const char* text, const NumberType& type,
    std::function<void(uint32_t)> emit, std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (!IsIntegral(type)) {
    ErrorMsgStream(error_msg) << "The expected type is not a integer type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const uint32_t bit_width = AssumedBitWidth(type);

  if (bit_width > 64) {
    ErrorMsgStream(error_msg)
        << "Unsupported " << bit_width << "-bit integer literals";
    return EncodeNumberStatus::kUnsupported;
  }

  // Either we are expecting anything or integer.
  bool is_negative = text[0] == '-';
  bool can_be_signed = IsSigned(type);

  if (is_negative && !can_be_signed) {
    ErrorMsgStream(error_msg)
        << "Cannot put a negative number in an unsigned literal";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const bool is_hex = text[0] == '0' && (text[1] == 'x' || text[1] == 'X');

  uint64_t decoded_bits;
  if (is_negative) {
    int64_t decoded_signed = 0;

    if (!ParseNumber(text, &decoded_signed)) {
      ErrorMsgStream(error_msg) << "Invalid signed integer literal: " << text;
      return EncodeNumberStatus::kInvalidText;
    }

    if (!CheckRangeAndIfHexThenSignExtend(decoded_signed, type, is_hex,
                                          &decoded_signed)) {
      ErrorMsgStream(error_msg)
          << "Integer " << (is_hex ? std::hex : std::dec) << std::showbase
          << decoded_signed << " does not fit in a " << std::dec << bit_width
          << "-bit " << (IsSigned(type) ? "signed" : "unsigned") << " integer";
      return EncodeNumberStatus::kInvalidText;
    }
    decoded_bits = decoded_signed;
  } else {
    // There's no leading minus sign, so parse it as an unsigned integer.
    if (!ParseNumber(text, &decoded_bits)) {
      ErrorMsgStream(error_msg) << "Invalid unsigned integer literal: " << text;
      return EncodeNumberStatus::kInvalidText;
    }
    if (!CheckRangeAndIfHexThenSignExtend(decoded_bits, type, is_hex,
                                          &decoded_bits)) {
      ErrorMsgStream(error_msg)
          << "Integer " << (is_hex ? std::hex : std::dec) << std::showbase
          << decoded_bits << " does not fit in a " << std::dec << bit_width
          << "-bit " << (IsSigned(type) ? "signed" : "unsigned") << " integer";
      return EncodeNumberStatus::kInvalidText;
    }
  }
  if (bit_width > 32) {
    uint32_t low = uint32_t(0x00000000ffffffff & decoded_bits);
    uint32_t high = uint32_t((0xffffffff00000000 & decoded_bits) >> 32);
    emit(low);
    emit(high);
  } else {
    emit(uint32_t(decoded_bits));
  }
  return EncodeNumberStatus::kSuccess;
}